

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_snd_env.cxx
# Opt level: O1

void __thiscall xray_re::xr_level_snd_env::save(xr_level_snd_env *this,xr_writer *w)

{
  pointer pbVar1;
  pointer value;
  
  xr_writer::open_chunk(w,0);
  pbVar1 = (this->m_env_ids).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (value = (this->m_env_ids).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; value != pbVar1; value = value + 1) {
    xr_writer::w_sz(w,value);
  }
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,1);
  xr_cform::save(&this->super_xr_cform,w);
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void xr_level_snd_env::save(xr_writer& w) const
{
	w.open_chunk(FSL_SND_ENV_IDS);
	w.w_seq(m_env_ids, xr_writer::f_w_sz());
	w.close_chunk();

	w.open_chunk(FSL_SND_ENV_GEOMETRY);
	xr_cform::save(w);
	w.close_chunk();
}